

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::RandomUniformStaticLayerParams::InternalSwap
          (RandomUniformStaticLayerParams *this,RandomUniformStaticLayerParams *other)

{
  RandomUniformStaticLayerParams *other_local;
  RandomUniformStaticLayerParams *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->outputshape_,&other->outputshape_);
  google::protobuf::internal::memswap<16>((char *)&this->seed_,(char *)&other->seed_);
  return;
}

Assistant:

void RandomUniformStaticLayerParams::InternalSwap(RandomUniformStaticLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  outputshape_.InternalSwap(&other->outputshape_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(RandomUniformStaticLayerParams, maxval_)
      + sizeof(RandomUniformStaticLayerParams::maxval_)
      - PROTOBUF_FIELD_OFFSET(RandomUniformStaticLayerParams, seed_)>(
          reinterpret_cast<char*>(&seed_),
          reinterpret_cast<char*>(&other->seed_));
}